

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

SessionSpecial * telnet_get_specials(Backend *be)

{
  Backend *be_local;
  
  return telnet_get_specials::specials;
}

Assistant:

static const SessionSpecial *telnet_get_specials(Backend *be)
{
    static const SessionSpecial specials[] = {
        {"Are You There", SS_AYT},
        {"Break", SS_BRK},
        {"Synch", SS_SYNCH},
        {"Erase Character", SS_EC},
        {"Erase Line", SS_EL},
        {"Go Ahead", SS_GA},
        {"No Operation", SS_NOP},
        {NULL, SS_SEP},
        {"Abort Process", SS_ABORT},
        {"Abort Output", SS_AO},
        {"Interrupt Process", SS_IP},
        {"Suspend Process", SS_SUSP},
        {NULL, SS_SEP},
        {"End Of Record", SS_EOR},
        {"End Of File", SS_EOF},
        {NULL, SS_EXITMENU}
    };
    return specials;
}